

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_23de0c::PulsePlayback::open(PulsePlayback *this,char *__file,int __oflag,...)

{
  bool bVar1;
  pa_stream_flags_t lhs;
  pa_stream_flags_t lhs_00;
  int iVar2;
  ALuint AVar3;
  int extraout_EAX;
  backend_exception *this_00;
  unique_lock<std::mutex> *plock_00;
  pa_stream *ppVar4;
  undefined8 uVar5;
  char *pcVar6;
  pa_operation *op;
  pa_sample_spec spec;
  pa_stream_flags_t flags;
  unique_lock<std::mutex> plock;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  iter;
  char *dev_name;
  char *pulse_name;
  PulseMainloop *in_stack_fffffffffffffea8;
  pa_stream_flags_t rhs;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb0;
  unique_lock<std::mutex> *plock_01;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffebc;
  PulseMainloop *in_stack_fffffffffffffec0;
  anon_class_8_1_898f2789_for__M_pred in_stack_fffffffffffffec8;
  pa_context *ppVar8;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  in_stack_fffffffffffffed0;
  code *pcVar9;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  in_stack_fffffffffffffed8;
  char *local_f8;
  pa_stream_flags_t flags_00;
  unique_lock<std::mutex> *plock_02;
  PulseMainloop *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  pa_sample_spec *in_stack_ffffffffffffff60;
  pa_channel_map *in_stack_ffffffffffffff68;
  BackendType in_stack_ffffffffffffff70;
  undefined4 local_78;
  undefined4 local_74;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  PulsePlayback *local_8;
  
  local_18 = (char *)0x0;
  local_20 = (char *)0x0;
  local_10 = __file;
  local_8 = this;
  if (__file != (char *)0x0) {
    bVar1 = std::
            vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            ::empty((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                     *)in_stack_fffffffffffffec0);
    if (bVar1) {
      PulseMainloop::probePlaybackDevices((PulseMainloop *)this);
    }
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    cbegin((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            *)in_stack_fffffffffffffea8);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    cend((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
          *)in_stack_fffffffffffffea8);
    local_28 = std::
               find_if<__gnu_cxx::__normal_iterator<(anonymous_namespace)::DevMap_const*,std::vector<(anonymous_namespace)::DevMap,al::allocator<(anonymous_namespace)::DevMap,8ul>>>,(anonymous_namespace)::PulsePlayback::open(char_const*)::__0>
                         (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                          in_stack_fffffffffffffec8);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    cend((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
          *)in_stack_fffffffffffffea8);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
                        *)in_stack_fffffffffffffea8);
    if (bVar1) {
      this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception
                (this_00,0xa004,"Device name \"%s\" not found",local_10);
      __cxa_throw(this_00,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception
                 );
    }
    __gnu_cxx::
    __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
    ::operator->(&local_28);
    local_18 = (char *)std::__cxx11::string::c_str();
    __gnu_cxx::
    __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
    ::operator->(&local_28);
    local_20 = (char *)std::__cxx11::string::c_str();
  }
  flags_00 = (pa_stream_flags_t)((ulong)&this->mMainloop >> 0x20);
  plock_02 = (unique_lock<std::mutex> *)&stack0xffffffffffffff98;
  PulseMainloop::getUniqueLock(in_stack_fffffffffffffea8);
  rhs = (pa_stream_flags_t)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  plock_00 = (unique_lock<std::mutex> *)
             PulseMainloop::connectContext(in_stack_ffffffffffffff40,plock_02);
  this->mContext = (pa_context *)plock_00;
  lhs = operator|(PA_STREAM_START_CORKED,PA_STREAM_FIX_FORMAT);
  lhs_00 = operator|(lhs,PA_STREAM_FIX_RATE);
  operator|(lhs_00,PA_STREAM_FIX_CHANNELS);
  iVar2 = GetConfigValueBool(in_stack_fffffffffffffec8.name,(char *)in_stack_fffffffffffffec0,
                             (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                             (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  if (iVar2 == 0) {
    operator|=((pa_stream_flags_t *)in_stack_fffffffffffffeb0,rhs);
  }
  memset(&local_78,0,0xc);
  local_78 = 3;
  local_74 = 0xac44;
  if (local_18 == (char *)0x0) {
    if (((anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::PulsePlayback::open(char_const*)::
                                     defname_abi_cxx11_), iVar2 != 0)) {
      al::getenv_abi_cxx11_((al *)&stack0xffffffffffffff60,"ALSOFT_PULSE_DEFAULT");
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::optional<true,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec0,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional(in_stack_fffffffffffffeb0);
      __cxa_atexit(al::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::~optional,
                   &(anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::PulsePlayback::open(char_const*)::
                           defname_abi_cxx11_);
    }
    bVar1 = al::optional::operator_cast_to_bool
                      ((optional *)
                       &(anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_)
    ;
    if (bVar1) {
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator->(&(anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_);
      local_18 = (char *)std::__cxx11::string::c_str();
    }
  }
  if (2 < (int)gLogLevel) {
    if (local_18 == (char *)0x0) {
      local_f8 = "(default)";
    }
    else {
      local_f8 = local_18;
    }
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Connecting to \"%s\"\n",local_f8);
  }
  uVar7 = 0;
  plock_01 = (unique_lock<std::mutex> *)0x0;
  ppVar4 = PulseMainloop::connectStream
                     ((PulseMainloop *)this,in_stack_ffffffffffffff48,plock_00,
                      (pa_context *)plock_02,flags_00,(pa_buffer_attr *)CONCAT44(lhs,lhs_00),
                      in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,in_stack_ffffffffffffff70)
  ;
  this->mStream = ppVar4;
  (*(anonymous_namespace)::ppa_stream_set_moved_callback)(this->mStream,streamMovedCallbackC);
  pcVar9 = (anonymous_namespace)::ppa_frame_size;
  uVar5 = (*(anonymous_namespace)::ppa_stream_get_sample_spec)(this->mStream);
  AVar3 = (*pcVar9)(uVar5);
  this->mFrameSize = AVar3;
  pcVar6 = (char *)(*(anonymous_namespace)::ppa_stream_get_device_name)(this->mStream);
  std::__cxx11::string::operator=((string *)&this->mDeviceName,pcVar6);
  if (local_20 == (char *)0x0) {
    ppVar8 = this->mContext;
    pcVar9 = (anonymous_namespace)::ppa_context_get_sink_info_by_name;
    uVar5 = std::__cxx11::string::c_str();
    (*pcVar9)(ppVar8,uVar5,sinkNameCallbackC,this);
    PulseMainloop::waitForOperation
              (in_stack_fffffffffffffec0,(pa_operation *)CONCAT44(in_stack_fffffffffffffebc,uVar7),
               plock_01);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&((this->super_BackendBase).mDevice)->DeviceName,local_20);
  }
  std::unique_lock<std::mutex>::~unique_lock(plock_01);
  return extraout_EAX;
}

Assistant:

void PulsePlayback::open(const ALCchar *name)
{
    const char *pulse_name{nullptr};
    const char *dev_name{nullptr};

    if(name)
    {
        if(PlaybackDevices.empty())
            mMainloop.probePlaybackDevices();

        auto iter = std::find_if(PlaybackDevices.cbegin(), PlaybackDevices.cend(),
            [name](const DevMap &entry) -> bool { return entry.name == name; });
        if(iter == PlaybackDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        pulse_name = iter->device_name.c_str();
        dev_name = iter->name.c_str();
    }

    auto plock = mMainloop.getUniqueLock();
    mContext = mMainloop.connectContext(plock);

    pa_stream_flags_t flags{PA_STREAM_START_CORKED | PA_STREAM_FIX_FORMAT | PA_STREAM_FIX_RATE |
        PA_STREAM_FIX_CHANNELS};
    if(!GetConfigValueBool(nullptr, "pulse", "allow-moves", 1))
        flags |= PA_STREAM_DONT_MOVE;

    pa_sample_spec spec{};
    spec.format = PA_SAMPLE_S16NE;
    spec.rate = 44100;
    spec.channels = 2;

    if(!pulse_name)
    {
        static const auto defname = al::getenv("ALSOFT_PULSE_DEFAULT");
        if(defname) pulse_name = defname->c_str();
    }
    TRACE("Connecting to \"%s\"\n", pulse_name ? pulse_name : "(default)");
    mStream = mMainloop.connectStream(pulse_name, plock, mContext, flags, nullptr, &spec, nullptr,
        BackendType::Playback);

    pa_stream_set_moved_callback(mStream, &PulsePlayback::streamMovedCallbackC, this);
    mFrameSize = static_cast<ALuint>(pa_frame_size(pa_stream_get_sample_spec(mStream)));

    mDeviceName = pa_stream_get_device_name(mStream);
    if(!dev_name)
    {
        pa_operation *op{pa_context_get_sink_info_by_name(mContext, mDeviceName.c_str(),
            &PulsePlayback::sinkNameCallbackC, this)};
        mMainloop.waitForOperation(op, plock);
    }
    else
        mDevice->DeviceName = dev_name;
}